

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp_mul.c
# Opt level: O2

void ppMul9(word *c,word *a,word *b,void *stack)

{
  void *stack_00;
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  
  ppMul3(c,a,b,stack);
  ppMul3(c + 6,a + 3,b + 3,stack);
  ppMul3(c + 0xc,a + 6,b + 6,stack);
  uVar1 = c[5];
  uVar2 = c[8];
  uVar3 = c[2] ^ uVar1 ^ uVar2;
  c[5] = uVar3;
  c[8] = uVar3 ^ c[0xe] ^ c[0xb];
  uVar8 = (uint)c[3] ^ (uint)c[6];
  uVar9 = *(uint *)((long)c + 0x1c) ^ *(uint *)((long)c + 0x34);
  uVar10 = (uint)c[4] ^ (uint)c[7];
  uVar11 = *(uint *)((long)c + 0x24) ^ *(uint *)((long)c + 0x3c);
  uVar4 = (uint)*c ^ uVar8;
  uVar5 = *(uint *)((long)c + 4) ^ uVar9;
  uVar6 = (uint)c[1] ^ uVar10;
  uVar7 = *(uint *)((long)c + 0xc) ^ uVar11;
  *(uint *)(c + 3) = uVar4;
  *(uint *)((long)c + 0x1c) = uVar5;
  *(uint *)(c + 4) = uVar6;
  *(uint *)((long)c + 0x24) = uVar7;
  uVar12 = (uint)c[0xc] ^ (uint)c[9];
  uVar13 = *(uint *)((long)c + 100) ^ *(uint *)((long)c + 0x4c);
  uVar14 = (uint)c[0xd] ^ (uint)c[10];
  uVar15 = *(uint *)((long)c + 0x6c) ^ *(uint *)((long)c + 0x54);
  *(uint *)(c + 6) = uVar4 ^ uVar12;
  *(uint *)((long)c + 0x34) = uVar5 ^ uVar13;
  *(uint *)(c + 7) = uVar6 ^ uVar14;
  *(uint *)((long)c + 0x3c) = uVar7 ^ uVar15;
  uVar12 = (uint)c[0xf] ^ uVar12;
  uVar13 = *(uint *)((long)c + 0x7c) ^ uVar13;
  uVar14 = (uint)c[0x10] ^ uVar14;
  uVar15 = *(uint *)((long)c + 0x84) ^ uVar15;
  *(uint *)(c + 9) = uVar8 ^ uVar12;
  *(uint *)((long)c + 0x4c) = uVar9 ^ uVar13;
  *(uint *)(c + 10) = uVar10 ^ uVar14;
  *(uint *)((long)c + 0x54) = uVar11 ^ uVar15;
  uVar3 = c[0xe] ^ c[0xb] ^ c[0x11];
  c[0xb] = uVar1 ^ uVar2 ^ uVar3;
  *(uint *)(c + 0xc) = uVar12;
  *(uint *)((long)c + 100) = uVar13;
  *(uint *)(c + 0xd) = uVar14;
  *(uint *)((long)c + 0x6c) = uVar15;
  c[0xe] = uVar3;
  *(word *)((long)stack + 0x30) = a[3] ^ *a;
  *(word *)((long)stack + 0x38) = a[4] ^ a[1];
  *(word *)((long)stack + 0x40) = a[5] ^ a[2];
  *(word *)((long)stack + 0x48) = b[3] ^ *b;
  *(word *)((long)stack + 0x50) = b[4] ^ b[1];
  *(word *)((long)stack + 0x58) = b[5] ^ b[2];
  *(word *)((long)stack + 0x60) = a[6] ^ *a;
  *(word *)((long)stack + 0x68) = a[7] ^ a[1];
  *(word *)((long)stack + 0x70) = a[8] ^ a[2];
  *(word *)((long)stack + 0x78) = b[6] ^ *b;
  *(word *)((long)stack + 0x80) = b[7] ^ b[1];
  *(word *)((long)stack + 0x88) = b[8] ^ b[2];
  stack_00 = (void *)((long)stack + 0x90);
  ppMul3((word *)stack,(word *)((long)stack + 0x30),(word *)((long)stack + 0x48),stack_00);
  c[3] = c[3] ^ *stack;
  c[4] = c[4] ^ *(ulong *)((long)stack + 8);
  c[5] = c[5] ^ *(ulong *)((long)stack + 0x10);
  c[6] = c[6] ^ *(ulong *)((long)stack + 0x18);
  c[7] = c[7] ^ *(ulong *)((long)stack + 0x20);
  c[8] = c[8] ^ *(ulong *)((long)stack + 0x28);
  ppMul3((word *)stack,(word *)((long)stack + 0x60),(word *)((long)stack + 0x78),stack_00);
  c[6] = c[6] ^ *stack;
  c[7] = c[7] ^ *(ulong *)((long)stack + 8);
  c[8] = c[8] ^ *(ulong *)((long)stack + 0x10);
  c[9] = c[9] ^ *(ulong *)((long)stack + 0x18);
  c[10] = c[10] ^ *(ulong *)((long)stack + 0x20);
  c[0xb] = c[0xb] ^ *(ulong *)((long)stack + 0x28);
  *(uint *)((long)stack + 0x60) = *(uint *)((long)stack + 0x60) ^ *(uint *)((long)stack + 0x30);
  *(uint *)((long)stack + 100) = *(uint *)((long)stack + 100) ^ *(uint *)((long)stack + 0x34);
  *(uint *)((long)stack + 0x68) = *(uint *)((long)stack + 0x68) ^ *(uint *)((long)stack + 0x38);
  *(uint *)((long)stack + 0x6c) = *(uint *)((long)stack + 0x6c) ^ *(uint *)((long)stack + 0x3c);
  *(uint *)((long)stack + 0x70) = *(uint *)((long)stack + 0x70) ^ *(uint *)((long)stack + 0x40);
  *(uint *)((long)stack + 0x74) = *(uint *)((long)stack + 0x74) ^ *(uint *)((long)stack + 0x44);
  *(uint *)((long)stack + 0x78) = *(uint *)((long)stack + 0x78) ^ *(uint *)((long)stack + 0x48);
  *(uint *)((long)stack + 0x7c) = *(uint *)((long)stack + 0x7c) ^ *(uint *)((long)stack + 0x4c);
  *(uint *)((long)stack + 0x80) = *(uint *)((long)stack + 0x80) ^ *(uint *)((long)stack + 0x50);
  *(uint *)((long)stack + 0x84) = *(uint *)((long)stack + 0x84) ^ *(uint *)((long)stack + 0x54);
  *(uint *)((long)stack + 0x88) = *(uint *)((long)stack + 0x88) ^ *(uint *)((long)stack + 0x58);
  *(uint *)((long)stack + 0x8c) = *(uint *)((long)stack + 0x8c) ^ *(uint *)((long)stack + 0x5c);
  ppMul3((word *)stack,(word *)((long)stack + 0x60),(word *)((long)stack + 0x78),stack_00);
  c[9] = c[9] ^ *stack;
  c[10] = c[10] ^ *(ulong *)((long)stack + 8);
  c[0xb] = c[0xb] ^ *(ulong *)((long)stack + 0x10);
  c[0xc] = c[0xc] ^ *(ulong *)((long)stack + 0x18);
  c[0xd] = c[0xd] ^ *(ulong *)((long)stack + 0x20);
  c[0xe] = c[0xe] ^ *(ulong *)((long)stack + 0x28);
  return;
}

Assistant:

static void ppMul9(word c[18], const word a[9], const word b[9], void* stack)
{
	word* t = (word*)stack;
	ASSERT(wwIsDisjoint2(a, 9, c, 18));
	ASSERT(wwIsDisjoint2(b, 9, c, 18));
	// c1 || c0 <- a0 b0
	ppMul3(c, a, b, t);
	// c3 || c2 <- a1 b1
	ppMul3(c + 6, a + 3, b + 3, t);
	// c5 || c4 <- a2 b2
	ppMul3(c + 12, a + 6, b + 6, t);
	// c1 <- c1 + c0 + c2
	c[3] ^= c[0] ^ c[6];
	c[4] ^= c[1] ^ c[7];
	c[5] ^= c[2] ^ c[8];
	// c2 <- c1 + c3 + c4
	c[6] = c[3] ^ c[9] ^ c[12];
	c[7] = c[4] ^ c[10] ^ c[13];
	c[8] = c[5] ^ c[11] ^ c[14];
	// c3 <- c2 + c0 + c5
	c[9] = c[6] ^ c[0] ^ c[15];
	c[10] = c[7] ^ c[1] ^ c[16];
	c[11] = c[8] ^ c[2] ^ c[17];
	// c4 <- c3 + c0 + c1
	c[12] = c[9] ^ c[0] ^ c[3];
	c[13] = c[10] ^ c[1] ^ c[4];
	c[14] = c[11] ^ c[2] ^ c[5];
	// t2 <- a0 + a1
	t[6] = a[0] ^ a[3];
	t[7] = a[1] ^ a[4];
	t[8] = a[2] ^ a[5];
	// t3 <- b0 + b1
	t[9] = b[0] ^ b[3];
	t[10] = b[1] ^ b[4];
	t[11] = b[2] ^ b[5];
	// t4 <- a0 + a2
	t[12] = a[0] ^ a[6];
	t[13] = a[1] ^ a[7];
	t[14] = a[2] ^ a[8];
	// t5 <- b0 + b2
	t[15] = b[0] ^ b[6];
	t[16] = b[1] ^ b[7];
	t[17] = b[2] ^ b[8];
	// t1 || t0 <- t2 t3
	ppMul3(t, t + 6, t + 9, t + 18);
	// c1 <- c1 + t0
	c[3] ^= t[0];
	c[4] ^= t[1];
	c[5] ^= t[2];
	// c2 <- c2 + t1
	c[6] ^= t[3];
	c[7] ^= t[4];
	c[8] ^= t[5];
	// t1 || t0 <- t4 t5
	ppMul3(t, t + 12, t + 15, t + 18);
	// c2 <- c2 + t0
	c[6] ^= t[0];
	c[7] ^= t[1];
	c[8] ^= t[2];
	// c3 <- c3 + t1
	c[9] ^= t[3];
	c[10] ^= t[4];
	c[11] ^= t[5];
	// t4 <- t4 + t2
	t[12] ^= t[6];
	t[13] ^= t[7];
	t[14] ^= t[8];
	// t5 <- t5 + t3
	t[15] ^= t[9];
	t[16] ^= t[10];
	t[17] ^= t[11];
	// t1 || t0 <- t4 t5
	ppMul3(t, t + 12, t + 15, t + 18);
	// c3 <- c3 + t0
	c[9] ^= t[0];
	c[10] ^= t[1];
	c[11] ^= t[2];
	// c4 <- c4 + t1
	c[12] ^= t[3];
	c[13] ^= t[4];
	c[14] ^= t[5];
}